

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ringbuffer_sink.h
# Opt level: O1

void __thiscall
spdlog::sinks::ringbuffer_sink<std::mutex>::ringbuffer_sink
          (ringbuffer_sink<std::mutex> *this,size_t n_items)

{
  allocator_type local_11;
  
  base_sink<std::mutex>::base_sink(&this->super_base_sink<std::mutex>);
  (this->super_base_sink<std::mutex>).super_sink._vptr_sink =
       (_func_int **)&PTR__ringbuffer_sink_0032c590;
  (this->q_).max_items_ = n_items + 1;
  (this->q_).head_ = 0;
  (this->q_).tail_ = 0;
  (this->q_).overrun_counter_ = 0;
  std::vector<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>::
  vector(&(this->q_).v_,n_items + 1,&local_11);
  return;
}

Assistant:

explicit ringbuffer_sink(size_t n_items)
        : q_{n_items}
    {}